

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void Curl_hash_destroy(Curl_hash *h)

{
  if (h->table != (Curl_hash_element **)0x0) {
    Curl_hash_clean(h);
    (*Curl_cfree)(h->table);
    h->table = (Curl_hash_element **)0x0;
  }
  h->slots = 0;
  return;
}

Assistant:

void
Curl_hash_destroy(struct Curl_hash *h)
{
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    Curl_hash_clean(h);
    Curl_safefree(h->table);
  }
  DEBUGASSERT(h->size == 0);
  h->slots = 0;
}